

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  uint uVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  RepeatedField<int> *pRVar5;
  int *piVar6;
  int tmp;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  LogFinisher local_69;
  LogMessage local_68;
  
  pVar7 = Insert(this,number);
  pEVar3 = pVar7.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated == false) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x227);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                         );
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    bVar1 = pEVar3->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 8) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x227);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    if (pEVar3->is_packed != packed) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x228);
      pLVar4 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
  }
  else {
    pEVar3->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 8) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x221);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    pEVar3->is_repeated = true;
    pEVar3->is_packed = packed;
    pRVar5 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<int>>(this->arena_);
    (pEVar3->field_0).repeated_int32_t_value = pRVar5;
  }
  pRVar5 = (pEVar3->field_0).repeated_int32_t_value;
  uVar2 = pRVar5->current_size_;
  if (uVar2 == pRVar5->total_size_) {
    RepeatedField<int>::Reserve(pRVar5,uVar2 + 1);
    piVar6 = RepeatedField<int>::elements(pRVar5);
    piVar6[uVar2] = value;
  }
  else {
    piVar6 = RepeatedField<int>::elements(pRVar5);
    piVar6[uVar2] = value;
  }
  pRVar5->current_size_ = uVar2 + 1;
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}